

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CompilationUnitSymbol::CompilationUnitSymbol
          (CompilationUnitSymbol *this,Compilation *compilation)

{
  TimeScale TVar1;
  PackageSymbol *pkg;
  WildcardImportSymbol *this_00;
  WildcardImportSymbol *import;
  PackageSymbol *stdPkg;
  SourceLocation local_30;
  string_view local_28;
  Compilation *local_18;
  Compilation *compilation_local;
  CompilationUnitSymbol *this_local;
  
  local_18 = compilation;
  compilation_local = (Compilation *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"");
  SourceLocation::SourceLocation(&local_30);
  Symbol::Symbol(&this->super_Symbol,CompilationUnit,local_28,local_30);
  Scope::Scope(&this->super_Scope,local_18,&this->super_Symbol);
  TimeScale::TimeScale(&this->timeScale);
  this->anyMembers = false;
  std::optional<slang::SourceRange>::optional(&this->unitsRange);
  std::optional<slang::SourceRange>::optional(&this->precisionRange);
  TVar1 = Compilation::getDefaultTimeScale(local_18);
  this->timeScale = TVar1;
  pkg = Compilation::getStdPackage(local_18);
  this_00 = BumpAllocator::
            emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                      (&local_18->super_BumpAllocator,&(pkg->super_Symbol).name,
                       (SourceLocation *)&SourceLocation::NoLocation);
  WildcardImportSymbol::setPackage(this_00,pkg);
  Scope::addWildcardImport(&this->super_Scope,this_00);
  return;
}

Assistant:

CompilationUnitSymbol::CompilationUnitSymbol(Compilation& compilation) :
    Symbol(SymbolKind::CompilationUnit, "", SourceLocation()), Scope(compilation, this) {

    // Default the time scale to the compilation default. If it turns out
    // this scope has a time unit declaration it will overwrite the member.
    timeScale = compilation.getDefaultTimeScale();

    // All compilation units import the std package automatically.
    auto& stdPkg = compilation.getStdPackage();
    auto import = compilation.emplace<WildcardImportSymbol>(stdPkg.name,
                                                            SourceLocation::NoLocation);
    import->setPackage(stdPkg);
    addWildcardImport(*import);
}